

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.h
# Opt level: O0

result_type __thiscall
beast::uhash<beast::spooky>::operator()
          (uhash<beast::spooky> *this,base_uint<160UL,_jbcoin::detail::AccountIDTag> *t)

{
  size_t sVar1;
  undefined1 local_148 [8];
  spooky h;
  base_uint<160UL,_jbcoin::detail::AccountIDTag> *t_local;
  uhash<beast::spooky> *this_local;
  
  h.state_._296_8_ = t;
  spooky::spooky((spooky *)local_148,1,2);
  hash_append<beast::spooky,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
            ((spooky *)local_148,(base_uint<160UL,_jbcoin::detail::AccountIDTag> *)h.state_._296_8_)
  ;
  sVar1 = spooky::operator_cast_to_unsigned_long((spooky *)local_148);
  return sVar1;
}

Assistant:

result_type
    operator()(T const& t) const noexcept
    {
        Hasher h;
        hash_append (h, t);
        return static_cast<result_type>(h);
    }